

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O1

double __thiscall test::avg_ts(test *this)

{
  long lVar1;
  double *pdVar2;
  double dVar3;
  undefined1 auVar4 [16];
  vector<double,_std::allocator<double>_> local_20;
  
  get_ts(&local_20,this);
  dVar3 = 0.0;
  pdVar2 = local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      dVar3 = dVar3 + *pdVar2;
      pdVar2 = pdVar2 + 1;
    } while (pdVar2 != local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    lVar1 = (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    auVar4._8_4_ = (int)((long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start >> 0x23);
    auVar4._0_8_ = lVar1;
    auVar4._12_4_ = 0x45300000;
    dVar3 = dVar3 / ((auVar4._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0));
  }
  if (local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return dVar3;
}

Assistant:

double avg_ts() const { return ::avg(get_ts()); }